

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O0

vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
* __thiscall
libtorrent::aux::read_endpoint_list<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
          (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           *__return_storage_ptr__,aux *this,bdecode_node *n)

{
  bool bVar1;
  type_t tVar2;
  int iVar3;
  char **in_00;
  char **in_01;
  basic_endpoint<boost::asio::ip::udp> local_b8;
  basic_endpoint<boost::asio::ip::udp> local_9c;
  char *local_80;
  char *in;
  bdecode_node e;
  int local_24;
  int local_20;
  int i;
  bdecode_node *n_local;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  *ret;
  
  bVar1 = false;
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::vector(__return_storage_ptr__);
  tVar2 = bdecode_node::type((bdecode_node *)this);
  if (tVar2 == list_t) {
    for (local_24 = 0; iVar3 = bdecode_node::list_size((bdecode_node *)this), local_24 < iVar3;
        local_24 = local_24 + 1) {
      bdecode_node::list_at((bdecode_node *)&in,(bdecode_node *)this,local_24);
      tVar2 = bdecode_node::type((bdecode_node *)&in);
      if (tVar2 == string_t) {
        iVar3 = bdecode_node::string_length((bdecode_node *)&in);
        if (iVar3 < 6) {
          local_20 = 4;
        }
        else {
          local_80 = bdecode_node::string_ptr((bdecode_node *)&in);
          iVar3 = bdecode_node::string_length((bdecode_node *)&in);
          if (iVar3 == 6) {
            read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
                      (&local_9c,(aux *)&local_80,in_00);
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
            ::push_back(__return_storage_ptr__,&local_9c);
          }
          else {
            iVar3 = bdecode_node::string_length((bdecode_node *)&in);
            if (iVar3 == 0x12) {
              read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
                        (&local_b8,(aux *)&local_80,in_01);
              ::std::
              vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
              ::push_back(__return_storage_ptr__,&local_b8);
            }
          }
          local_20 = 0;
        }
      }
      else {
        bVar1 = true;
        local_20 = 1;
      }
      bdecode_node::~bdecode_node((bdecode_node *)&in);
      if ((local_20 != 0) && (local_20 != 4)) goto LAB_007e0773;
    }
    bVar1 = true;
  }
  else {
    bVar1 = true;
  }
LAB_007e0773:
  if (!bVar1) {
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<EndpointType> read_endpoint_list(libtorrent::bdecode_node const& n)
	{
		std::vector<EndpointType> ret;
		if (n.type() != bdecode_node::list_t) return ret;
		for (int i = 0; i < n.list_size(); ++i)
		{
			bdecode_node e = n.list_at(i);
			if (e.type() != bdecode_node::string_t) return ret;
			if (e.string_length() < 6) continue;
			char const* in = e.string_ptr();
			if (e.string_length() == 6)
				ret.push_back(read_v4_endpoint<EndpointType>(in));
			else if (e.string_length() == 18)
				ret.push_back(read_v6_endpoint<EndpointType>(in));
		}
		return ret;
	}